

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void uWS::Group<true>::timerCallback(uv_timer_t *timer)

{
  long lVar1;
  size_t *in_RDI;
  Group<true> *unaff_retaddr;
  anon_class_1_0_00000001 *in_stack_00000008;
  Group<true> *in_stack_00000010;
  Group<true> *group;
  OpCode in_stack_ffffffffffffffef;
  size_t length;
  
  length = *in_RDI;
  forEach<uWS::Group<true>::timerCallback(uv_timer_s*)::_lambda(uWS::WebSocket<true>)_1_>
            (in_stack_00000010,in_stack_00000008);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    broadcast(unaff_retaddr,(char *)in_RDI,length,in_stack_ffffffffffffffef);
  }
  else {
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    broadcast(unaff_retaddr,(char *)in_RDI,length,in_stack_ffffffffffffffef);
  }
  return;
}

Assistant:

void Group<isServer>::timerCallback(uv_timer_t *timer) {
    Group<isServer> *group = (Group<isServer> *) timer->data;

    group->forEach([](uWS::WebSocket<isServer> ws) {
        typename uWS::WebSocket<isServer>::Data *webSocketData = (typename uWS::WebSocket<isServer>::Data *) ws.getSocketData();
        if (webSocketData->hasOutstandingPong) {
            ws.terminate();
        } else {
            webSocketData->hasOutstandingPong = true;
        }
    });

    if (group->userPingMessage.length()) {
        group->broadcast(group->userPingMessage.data(), group->userPingMessage.length(), OpCode::TEXT);
    } else {
        group->broadcast(nullptr, 0, OpCode::PING);
    }
}